

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O1

Value ** __thiscall
ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(ValueHashTable<Sym_*,_Value_*> *this,Sym *value)

{
  uint uVar1;
  uint uVar2;
  NodeBase *pNVar3;
  bool bVar4;
  char cVar5;
  Type *pTVar6;
  Type *unaff_R12;
  uint depth;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  uVar1 = value->m_id;
  local_58 = (undefined1  [8])(this->table + (ulong)uVar1 % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  depth = 1;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_58;
  iter.last = (NodeBase *)this;
  do {
    bVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_58);
    if (!bVar4) goto LAB_0042629a;
    pTVar6 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_58);
    uVar2 = pTVar6->value->m_id;
    if (uVar2 != uVar1) {
      pTVar6 = unaff_R12;
    }
    if (uVar2 <= uVar1) {
      unaff_R12 = pTVar6;
    }
    cVar5 = (uVar2 != uVar1) * '\x02' + '\x01';
    if (uVar1 < uVar2) {
      cVar5 = '\0';
    }
    depth = depth + (uVar1 < uVar2);
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_0042629a:
    pNVar3 = iter.last;
    unaff_R12 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::InsertNodeBefore
                          ((EditingIterator *)local_58,(ArenaAllocator *)(iter.last)->next);
    unaff_R12->value = value;
    if ((DictionaryStats *)pNVar3[3].next != (DictionaryStats *)0x0) {
      DictionaryStats::Insert((DictionaryStats *)pNVar3[3].next,depth);
    }
  }
  return &unaff_R12->element;
}

Assistant:

TElement * FindOrInsertNew(TData value)
    {
        uint key = Key::Get(value);
        uint hash = this->Hash(key);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[hash], iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        HashBucket * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }